

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzautopointer.h
# Opt level: O0

void __thiscall TPZAutoPointer<TPZMatrix<double>_>::TPZReference::TPZReference(TPZReference *this)

{
  atomic<int> *in_RDI;
  atomic<int> *paVar1;
  memory_order __b;
  __integral_type in_stack_ffffffffffffffbc;
  
  *(undefined8 *)in_RDI = 0;
  paVar1 = in_RDI + 2;
  std::atomic<int>::atomic(in_RDI,in_stack_ffffffffffffffbc);
  *(undefined8 *)in_RDI = 0;
  std::operator&(memory_order_seq_cst,__memory_order_mask);
  LOCK();
  (paVar1->super___atomic_base<int>)._M_i = 1;
  UNLOCK();
  return;
}

Assistant:

TPZReference()
        {
            fPointer = nullptr;
            fCounter.store(1);
        }